

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int gmfsetkwdf77_(int64_t *MshIdx,int *KwdIdx,int *NmbLin,int *NmbTyp,int *TypTab,int *deg,
                 int *NmbNod)

{
  char *__s1;
  int iVar1;
  int iVar2;
  
  iVar2 = *KwdIdx;
  __s1 = GmfKwdFmt[iVar2][2];
  iVar1 = strcmp(__s1,"hr");
  if (iVar1 == 0) {
    iVar2 = GmfSetKwd(*MshIdx,iVar2,(long)*NmbLin,(ulong)(uint)*NmbTyp,TypTab,(ulong)(uint)*deg,
                      *NmbNod);
    return iVar2;
  }
  iVar1 = strcmp(__s1,"sr");
  if (iVar1 != 0) {
    iVar2 = GmfSetKwd(*MshIdx,iVar2,(long)*NmbLin);
    return iVar2;
  }
  iVar2 = GmfSetKwd(*MshIdx,iVar2,(long)*NmbLin,(ulong)(uint)*NmbTyp,TypTab);
  return iVar2;
}

Assistant:

int APIF77(gmfsetkwdf77)(  int64_t *MshIdx, int *KwdIdx, int *NmbLin,
                           int *NmbTyp, int *TypTab, int *deg, int *NmbNod )
{
   if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "hr"))
      return(GmfSetKwd(*MshIdx, *KwdIdx, *NmbLin, *NmbTyp, TypTab, *deg, *NmbNod));
   else if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "sr"))
      return(GmfSetKwd(*MshIdx, *KwdIdx, *NmbLin, *NmbTyp, TypTab));
   else
      return(GmfSetKwd(*MshIdx, *KwdIdx, *NmbLin));
}